

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

text * __thiscall lest::env::sections_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  pointer pbVar1;
  long lVar2;
  long lVar3;
  text msg;
  pointer local_78;
  size_type local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  text *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->opt).verbose == false) {
    std::__cxx11::string::string((string *)&local_78,"",(allocator *)&local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_78 == &local_68) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_60;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_78;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
    }
    __return_storage_ptr__->_M_string_length = local_70;
  }
  else {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = '\0';
    lVar3 = 0;
    local_58 = __return_storage_ptr__;
    for (lVar2 = 0;
        pbVar1 = (this->ctx).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar2 != (long)(this->ctx).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
        lVar2 = lVar2 + 1) {
      std::operator+(&local_50,"\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
      std::__cxx11::string::append((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      lVar3 = lVar3 + 0x20;
    }
    (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
    if (local_78 == &local_68) {
      (local_58->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
      *(undefined8 *)((long)&local_58->field_2 + 8) = uStack_60;
    }
    else {
      (local_58->_M_dataplus)._M_p = local_78;
      (local_58->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
    }
    local_58->_M_string_length = local_70;
    __return_storage_ptr__ = local_58;
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }